

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

void __thiscall
t_c_glib_generator::generate_serialize_field
          (t_c_glib_generator *this,ostream *out,t_field *tfield,string *prefix,string *suffix,
          int error_ret)

{
  undefined8 uVar1;
  byte bVar2;
  t_type *type_00;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ostream *poVar4;
  logic_error *this_00;
  undefined1 auVar5 [12];
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  string local_140;
  undefined1 local_119;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  t_base local_d4;
  undefined1 local_d0 [4];
  t_base tbase;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string name;
  t_type *type;
  int error_ret_local;
  string *suffix_local;
  string *prefix_local;
  t_field *tfield_local;
  ostream *out_local;
  t_c_glib_generator *this_local;
  
  type_00 = t_field::get_type(tfield);
  name.field_2._8_8_ = t_generator::get_true_type(type_00);
  __rhs = t_field::get_name_abi_cxx11_(tfield);
  std::operator+(&local_80,prefix,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 &local_80,suffix);
  std::__cxx11::string::~string((string *)&local_80);
  bVar2 = (**(code **)(*(long *)name.field_2._8_8_ + 0x20))();
  if ((bVar2 & 1) != 0) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(pbVar3,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
    __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  bVar2 = (**(code **)(*(long *)name.field_2._8_8_ + 0x58))();
  if (((bVar2 & 1) == 0) &&
     (bVar2 = (**(code **)(*(long *)name.field_2._8_8_ + 0x60))(), (bVar2 & 1) == 0)) {
    bVar2 = (**(code **)(*(long *)name.field_2._8_8_ + 0x68))();
    uVar1 = name.field_2._8_8_;
    if ((bVar2 & 1) == 0) {
      bVar2 = (**(code **)(*(long *)name.field_2._8_8_ + 0x28))();
      if (((bVar2 & 1) == 0) &&
         (bVar2 = (**(code **)(*(long *)name.field_2._8_8_ + 0x50))(), (bVar2 & 1) == 0)) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_1c0,"DO NOT KNOW HOW TO SERIALIZE FIELD \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                      );
        std::operator+(&local_1a0,&local_1c0,"\' TYPE \'");
        type_name_abi_cxx11_(&local_1e0,this,(t_type *)name.field_2._8_8_,false,false);
        std::operator+(&local_180,&local_1a0,&local_1e0);
        std::logic_error::logic_error(this_00,(string *)&local_180);
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::operator<<(poVar4,"if ((ret = thrift_protocol_write_");
      bVar2 = (**(code **)(*(long *)name.field_2._8_8_ + 0x28))();
      if ((bVar2 & 1) == 0) {
        poVar4 = std::operator<<(out,"i32 (protocol, (gint32) ");
        std::operator<<(poVar4,(string *)local_60);
      }
      else {
        local_d4 = t_base_type::get_base((t_base_type *)name.field_2._8_8_);
        switch(local_d4) {
        case TYPE_VOID:
          pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::operator+(pbVar3,"compiler error: cannot serialize void field in a struct: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_60);
          __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        case TYPE_STRING:
          bVar2 = (**(code **)(*(long *)name.field_2._8_8_ + 0x38))();
          if ((bVar2 & 1) == 0) {
            poVar4 = std::operator<<(out,"string (protocol, ");
            std::operator<<(poVar4,(string *)local_60);
          }
          else {
            poVar4 = std::operator<<(out,"binary (protocol, ");
            poVar4 = std::operator<<(poVar4,(string *)local_60);
            poVar4 = std::operator<<(poVar4," ? ((GByteArray *) ");
            poVar4 = std::operator<<(poVar4,(string *)local_60);
            poVar4 = std::operator<<(poVar4,")->data : NULL, ");
            poVar4 = std::operator<<(poVar4,(string *)local_60);
            poVar4 = std::operator<<(poVar4," ? ((GByteArray *) ");
            poVar4 = std::operator<<(poVar4,(string *)local_60);
            std::operator<<(poVar4,")->len : 0");
          }
          break;
        case TYPE_BOOL:
          poVar4 = std::operator<<(out,"bool (protocol, ");
          std::operator<<(poVar4,(string *)local_60);
          break;
        case TYPE_I8:
          poVar4 = std::operator<<(out,"byte (protocol, ");
          std::operator<<(poVar4,(string *)local_60);
          break;
        case TYPE_I16:
          poVar4 = std::operator<<(out,"i16 (protocol, ");
          std::operator<<(poVar4,(string *)local_60);
          break;
        case TYPE_I32:
          poVar4 = std::operator<<(out,"i32 (protocol, ");
          std::operator<<(poVar4,(string *)local_60);
          break;
        case TYPE_I64:
          poVar4 = std::operator<<(out,"i64 (protocol, ");
          std::operator<<(poVar4,(string *)local_60);
          break;
        case TYPE_DOUBLE:
          poVar4 = std::operator<<(out,"double (protocol, ");
          std::operator<<(poVar4,(string *)local_60);
          break;
        default:
          local_119 = 1;
          auVar5 = __cxa_allocate_exception(0x20);
          t_base_type::t_base_name_abi_cxx11_
                    (&local_118,(t_base_type *)(ulong)local_d4,auVar5._8_4_);
          std::operator+(&local_f8,"compiler error: no C writer for base type ",&local_118);
          std::operator+(auVar5._0_8_,&local_f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_60);
          local_119 = 0;
          __cxa_throw(auVar5._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
      }
      poVar4 = std::operator<<(out,", error)) < 0)");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_140,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_140);
      poVar4 = std::operator<<(poVar4,"  return ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,error_ret);
      poVar4 = std::operator<<(poVar4,";");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_160);
      poVar4 = std::operator<<(poVar4,"xfer += ret;");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_140);
    }
    else {
      std::__cxx11::string::string((string *)local_d0,(string *)local_60);
      generate_serialize_container(this,out,(t_type *)uVar1,(string *)local_d0,error_ret);
      std::__cxx11::string::~string((string *)local_d0);
    }
  }
  else {
    uVar1 = name.field_2._8_8_;
    std::__cxx11::string::string((string *)&local_b0,(string *)local_60);
    generate_serialize_struct(this,out,(t_struct *)uVar1,&local_b0,error_ret);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void t_c_glib_generator::generate_serialize_field(ostream& out,
                                                  t_field* tfield,
                                                  string prefix,
                                                  string suffix,
                                                  int error_ret) {
  t_type* type = get_true_type(tfield->get_type());
  string name = prefix + tfield->get_name() + suffix;

  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + name;
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, name, error_ret);
  } else if (type->is_container()) {
    generate_serialize_container(out, type, name, error_ret);
  } else if (type->is_base_type() || type->is_enum()) {
    indent(out) << "if ((ret = thrift_protocol_write_";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_BOOL:
        out << "bool (protocol, " << name;
        break;
      case t_base_type::TYPE_I8:
        out << "byte (protocol, " << name;
        break;
      case t_base_type::TYPE_I16:
        out << "i16 (protocol, " << name;
        break;
      case t_base_type::TYPE_I32:
        out << "i32 (protocol, " << name;
        break;
      case t_base_type::TYPE_I64:
        out << "i64 (protocol, " << name;
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "double (protocol, " << name;
        break;
      case t_base_type::TYPE_STRING:
        if (type->is_binary()) {
          out << "binary (protocol, " << name << " ? ((GByteArray *) " << name << ")->data : NULL, "
              << name << " ? ((GByteArray *) " << name << ")->len : 0";
        } else {
          out << "string (protocol, " << name;
        }
        break;
      default:
        throw "compiler error: no C writer for base type " + t_base_type::t_base_name(tbase) + name;
      }
    } else {
      out << "i32 (protocol, (gint32) " << name;
    }
    out << ", error)) < 0)" << endl
        << indent() << "  return " << error_ret << ";" << endl
        << indent() << "xfer += ret;" << endl << endl;
  } else {
    throw std::logic_error("DO NOT KNOW HOW TO SERIALIZE FIELD '" + name + "' TYPE '"
                           + type_name(type));
  }
}